

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_ec_cp_sign(EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbs_len)

{
  int iVar1;
  EVP_PKEY *pkey_00;
  ECDSA_SIG *pEVar2;
  long *in_RDX;
  long in_RSI;
  EVP_PKEY_CTX *in_RDI;
  ECDSA_SIG *in_R8;
  int order;
  EVP_PKEY *pkey;
  ECDSA_SIG *unpacked_sig;
  int iVar3;
  int local_4;
  
  pkey_00 = EVP_PKEY_CTX_get0_pkey(in_RDI);
  if (in_RDX == (long *)0x0) {
    local_4 = 0;
  }
  else if (pkey_00 == (EVP_PKEY *)0x0) {
    local_4 = 0;
  }
  else {
    iVar1 = EVP_PKEY_get_base_id(pkey_00);
    if (((iVar1 == 0x32b) || (iVar1 == 0x331)) || (iVar1 == 0x3d3)) {
      iVar3 = 0x40;
    }
    else {
      if (iVar1 != 0x3d4) {
        return 0;
      }
      iVar3 = 0x80;
    }
    if (in_RSI == 0) {
      *in_RDX = (long)iVar3;
      local_4 = 1;
    }
    else {
      EVP_PKEY_get0(pkey_00);
      pEVar2 = gost_ec_sign((uchar *)siglen,tbs._4_4_,(EC_KEY *)tbs_len);
      if (pEVar2 == (ECDSA_SIG *)0x0) {
        local_4 = 0;
      }
      else {
        local_4 = pack_sign_cp(in_R8,(int)((ulong)pEVar2 >> 0x20),(uchar *)pkey_00,
                               (size_t *)CONCAT44(iVar3,iVar1));
      }
    }
  }
  return local_4;
}

Assistant:

static int pkey_gost_ec_cp_sign(EVP_PKEY_CTX *ctx, unsigned char *sig,
                                size_t *siglen, const unsigned char *tbs,
                                size_t tbs_len)
{
    ECDSA_SIG *unpacked_sig = NULL;
    EVP_PKEY *pkey = EVP_PKEY_CTX_get0_pkey(ctx);
    int order = 0;

    if (!siglen)
        return 0;
    if (!pkey)
        return 0;

    switch (EVP_PKEY_base_id(pkey)) {
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
    case NID_id_GostR3410_2012_256:
        order = 64;
        break;
    case NID_id_GostR3410_2012_512:
        order = 128;
        break;
    default:
        return 0;
    }

    if (!sig) {
        *siglen = order;
        return 1;
    }
    unpacked_sig = gost_ec_sign(tbs, tbs_len, EVP_PKEY_get0(pkey));
    if (!unpacked_sig) {
        return 0;
    }
    return pack_sign_cp(unpacked_sig, order / 2, sig, siglen);
}